

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::store_flattened_struct
          (CompilerGLSL *this,string *basename,uint32_t rhs_id,SPIRType *type,
          SmallVector<unsigned_int,_8UL> *indices)

{
  uint *puVar1;
  size_t sVar2;
  SPIRType *type_00;
  SPIRType *pSVar3;
  long lVar4;
  SmallVector<unsigned_int,_8UL> *indices_00;
  ulong uVar5;
  string lhs;
  SmallVector<unsigned_int,_8UL> sub_indices;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rhs;
  string local_50;
  
  indices_00 = indices;
  SmallVector<unsigned_int,_8UL>::SmallVector(&sub_indices,indices);
  lhs._M_dataplus._M_p._0_4_ = 0;
  SmallVector<unsigned_int,_8UL>::push_back(&sub_indices,(uint *)&lhs);
  puVar1 = (indices->super_VectorView<unsigned_int>).ptr;
  sVar2 = (indices->super_VectorView<unsigned_int>).buffer_size;
  type_00 = type;
  for (lVar4 = 0; sVar2 << 2 != lVar4; lVar4 = lVar4 + 4) {
    type_00 = Compiler::get<spirv_cross::SPIRType>
                        (&this->super_Compiler,
                         (type_00->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                         [*(uint *)((long)puVar1 + lVar4)].id);
  }
  for (uVar5 = 0;
      uVar5 < (uint)(type_00->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
      uVar5 = uVar5 + 1) {
    sub_indices.super_VectorView<unsigned_int>.ptr
    [sub_indices.super_VectorView<unsigned_int>.buffer_size - 1] = (uint32_t)uVar5;
    to_member_name_abi_cxx11_(&rhs,this,type_00,(uint32_t)uVar5);
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
              (&lhs,(spirv_cross *)basename,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3835c0,
               (char (*) [2])&rhs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)indices_00);
    ::std::__cxx11::string::~string((string *)&rhs);
    ParsedIR::sanitize_underscores(&lhs);
    pSVar3 = Compiler::get<spirv_cross::SPIRType>
                       (&this->super_Compiler,
                        (type_00->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar5].id
                       );
    if (*(int *)&(pSVar3->super_IVariant).field_0xc == 0xf) {
      indices_00 = &sub_indices;
      store_flattened_struct(this,&lhs,rhs_id,type,indices_00);
    }
    else {
      to_expression_abi_cxx11_(&local_90,this,rhs_id,true);
      to_multi_member_reference_abi_cxx11_(&local_50,this,type,&sub_indices);
      ::std::operator+(&rhs,&local_90,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_90);
      indices_00 = (SmallVector<unsigned_int,_8UL> *)0x37e4df;
      statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (this,&lhs,(char (*) [4])0x395f16,&rhs,(char (*) [2])0x37e4df);
      ::std::__cxx11::string::~string((string *)&rhs);
    }
    ::std::__cxx11::string::~string((string *)&lhs);
  }
  SmallVector<unsigned_int,_8UL>::~SmallVector(&sub_indices);
  return;
}

Assistant:

void CompilerGLSL::store_flattened_struct(const string &basename, uint32_t rhs_id, const SPIRType &type,
                                          const SmallVector<uint32_t> &indices)
{
	SmallVector<uint32_t> sub_indices = indices;
	sub_indices.push_back(0);

	auto *member_type = &type;
	for (auto &index : indices)
		member_type = &get<SPIRType>(member_type->member_types[index]);

	for (uint32_t i = 0; i < uint32_t(member_type->member_types.size()); i++)
	{
		sub_indices.back() = i;
		auto lhs = join(basename, "_", to_member_name(*member_type, i));
		ParsedIR::sanitize_underscores(lhs);

		if (get<SPIRType>(member_type->member_types[i]).basetype == SPIRType::Struct)
		{
			store_flattened_struct(lhs, rhs_id, type, sub_indices);
		}
		else
		{
			auto rhs = to_expression(rhs_id) + to_multi_member_reference(type, sub_indices);
			statement(lhs, " = ", rhs, ";");
		}
	}
}